

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

Literal * __thiscall wasm::Literal::extendToF64(Literal *__return_storage_ptr__,Literal *this)

{
  if ((this->type).id == 4) {
    *(double *)&__return_storage_ptr__->field_0 = (double)*(float *)&this->field_0;
    (__return_storage_ptr__->type).id = 5;
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::f32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x2ac,"Literal wasm::Literal::extendToF64() const");
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }